

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O1

bool AString_shrinkToFit(AString *str)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  
  bVar2 = false;
  if (str != (AString *)0x0) {
    uVar3 = 8;
    if (8 < str->size) {
      uVar3 = str->size;
    }
    if (uVar3 < str->capacity) {
      pcVar1 = (char *)(*str->reallocator)(str->buffer,uVar3 + 1);
      if (pcVar1 == (char *)0x0) {
        return false;
      }
      str->capacity = uVar3;
      str->buffer = pcVar1;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

ACUTILS_HD_FUNC bool AString_shrinkToFit(struct AString *str)
{
    if(str != nullptr) {
        size_t newCapacity = (str->size < private_ACUtils_AString_capacityMin) ? private_ACUtils_AString_capacityMin : str->size;
        if(newCapacity < str->capacity) {
            char *tmpBuffer = (char *) str->reallocator(str->buffer, (newCapacity + 1) * sizeof(char));
            if(tmpBuffer != nullptr) {
                str->capacity = newCapacity;
                str->buffer = tmpBuffer;
                return true;
            }
        } else {
            return true;
        }
    }
    return false;
}